

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TreeNodeBehavior(ImGuiID id,ImGuiTreeNodeFlags flags,char *label,char *label_end)

{
  ImVec2 pos;
  ImVec2 pos_00;
  ImVec2 pos_01;
  ImVec2 pos_02;
  ImVec2 pos_03;
  ImVec2 IVar1;
  ImVec2 *in_RCX;
  ImVec2 *in_RDX;
  uint in_ESI;
  ImGuiID in_EDI;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float _x;
  ImVec2 IVar6;
  ImU32 bg_col_1;
  ImU32 bg_col;
  ImGuiNavHighlightFlags nav_highlight_flags;
  ImU32 text_col;
  bool toggled;
  bool pressed;
  bool held;
  bool hovered;
  bool was_selected;
  bool selected;
  bool is_mouse_x_over_arrow;
  float arrow_hit_x2;
  float arrow_hit_x1;
  ImGuiButtonFlags button_flags;
  bool item_add;
  bool is_open;
  bool is_leaf;
  ImRect interact_bb;
  ImVec2 text_pos;
  float text_width;
  float text_offset_y;
  float text_offset_x;
  ImRect frame_bb;
  float frame_height;
  ImVec2 label_size;
  ImVec2 padding;
  bool display_frame;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImDrawList *in_stack_fffffffffffffe88;
  float in_stack_fffffffffffffe90;
  float in_stack_fffffffffffffe94;
  undefined8 in_stack_fffffffffffffea0;
  ImGuiCol idx;
  float in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeac;
  ImVec2 *in_stack_fffffffffffffeb0;
  ImRect *in_stack_fffffffffffffeb8;
  ImGuiStorage *in_stack_fffffffffffffec0;
  ImVec2 *text_size_if_known;
  ImDrawList *in_stack_fffffffffffffec8;
  undefined1 hide_text_after_hash;
  ImDrawList *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 uVar7;
  undefined2 in_stack_fffffffffffffedc;
  byte in_stack_fffffffffffffede;
  undefined1 uVar8;
  float fVar9;
  float local_118;
  float rounding;
  float fVar10;
  float in_stack_fffffffffffffef4;
  ImVec2 in_stack_fffffffffffffef8;
  ImVec2 in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff0c;
  ImRect *in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff28;
  float in_stack_ffffffffffffff2c;
  ImVec2 in_stack_ffffffffffffff30;
  ImVec2 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  ImU32 local_b0;
  undefined4 local_ac;
  ImU32 local_a8;
  bool local_a3;
  undefined1 local_a2;
  byte local_a1;
  byte local_a0;
  byte local_9f;
  byte local_9e;
  byte local_9d;
  float local_9c;
  float local_98;
  uint local_94;
  undefined1 local_8f;
  byte local_8e;
  byte local_8d;
  undefined8 local_8c;
  undefined8 local_84;
  ImVec2 local_7c;
  float in_stack_ffffffffffffff8c;
  float in_stack_ffffffffffffff90;
  float fVar11;
  float local_58;
  float local_4c;
  float fStack_48;
  ImVec2 local_44;
  byte local_39;
  ImGuiStyle *local_38;
  ImGuiContext *local_30;
  ImGuiWindow *local_28;
  ImVec2 *local_20;
  ImVec2 *local_18;
  uint local_c;
  ImGuiID local_8;
  bool local_1;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_EDI;
  local_28 = GetCurrentWindow();
  if ((local_28->SkipItems & 1U) == 0) {
    local_30 = GImGui;
    local_38 = &GImGui->Style;
    local_39 = (local_c & 2) != 0;
    if (((bool)local_39) || ((local_c & 0x400) != 0)) {
      local_44 = (GImGui->Style).FramePadding;
    }
    else {
      in_stack_fffffffffffffef4 = (GImGui->Style).FramePadding.x;
      fVar2 = ImMin<float>((local_28->DC).CurrLineTextBaseOffset,(GImGui->Style).FramePadding.y);
      ImVec2::ImVec2(&local_44,in_stack_fffffffffffffef4,fVar2);
    }
    if (local_20 == (ImVec2 *)0x0) {
      local_20 = (ImVec2 *)FindRenderedTextEnd((char *)local_18,(char *)0x0);
    }
    IVar6 = CalcTextSize((char *)in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,
                         SUB41((uint)in_stack_fffffffffffffeac >> 0x18,0),in_stack_fffffffffffffea8)
    ;
    fVar2 = (local_38->FramePadding).y;
    fVar2 = ImMin<float>((local_28->DC).CurrLineSize.y,fVar2 + fVar2 + local_30->FontSize);
    fStack_48 = IVar6.y;
    fVar2 = ImMax<float>(fVar2,local_44.y + local_44.y + fStack_48);
    ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    if ((local_c & 0x1000) == 0) {
      fVar10 = (local_28->DC).CursorPos.x;
    }
    else {
      fVar10 = (local_28->WorkRect).Min.x;
    }
    fVar11 = (local_28->DC).CursorPos.y;
    local_58 = (local_28->WorkRect).Max.x;
    fVar3 = (local_28->DC).CursorPos.y + fVar2;
    fVar4 = fVar10;
    if ((local_39 & 1) != 0) {
      fVar4 = fVar10 - (float)(int)((local_28->WindowPadding).x * 0.5 + -1.0);
      local_58 = (float)(int)((local_28->WindowPadding).x * 0.5) + local_58;
    }
    rounding = local_30->FontSize;
    if ((local_39 & 1) == 0) {
      local_118 = local_44.x * 2.0;
    }
    else {
      local_118 = local_44.x * 3.0;
    }
    local_118 = rounding + local_118;
    fVar5 = ImMax<float>(local_44.y,(local_28->DC).CurrLineTextBaseOffset);
    fVar9 = local_30->FontSize;
    local_4c = IVar6.x;
    if (local_4c <= 0.0) {
      local_4c = 0.0;
    }
    else {
      local_4c = local_44.x + local_44.x + local_4c;
    }
    _x = fVar9 + local_4c;
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff8c,(local_28->DC).CursorPos.x + local_118,
                   (local_28->DC).CursorPos.y + fVar5);
    ImVec2::ImVec2(&local_7c,_x,fVar2);
    ItemSize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    local_8c = CONCAT44(fVar11,fVar4);
    local_84 = CONCAT44(fVar3,local_58);
    if (((local_39 & 1) == 0) && ((local_c & 0x1800) == 0)) {
      fVar2 = (local_38->ItemSpacing).x;
      local_84 = CONCAT44(fVar3,fVar2 + fVar2 + fVar4 + _x);
    }
    local_8d = (local_c & 0x100) != 0;
    local_8e = TreeNodeUpdateNextOpen
                         ((ImGuiID)in_stack_fffffffffffffeb0,
                          (ImGuiTreeNodeFlags)in_stack_fffffffffffffeac);
    if (((((bool)local_8e) && ((local_30->NavIdIsAlive & 1U) == 0)) && ((local_c & 0x2000) != 0)) &&
       ((local_c & 8) == 0)) {
      (local_28->DC).TreeJumpToParentOnPopMask =
           1 << ((byte)(local_28->DC).TreeDepth & 0x1f) | (local_28->DC).TreeJumpToParentOnPopMask;
    }
    local_8f = ItemAdd(in_stack_fffffffffffffeb8,(ImGuiID)((ulong)in_stack_fffffffffffffeb0 >> 0x20)
                       ,(ImRect *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                       (ImGuiItemFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
    (local_30->LastItemData).StatusFlags = (local_30->LastItemData).StatusFlags | 2;
    IVar6.y = fVar11;
    IVar6.x = fVar4;
    (local_30->LastItemData).DisplayRect.Min = IVar6;
    IVar1.y = fVar3;
    IVar1.x = local_58;
    (local_30->LastItemData).DisplayRect.Max = IVar1;
    if ((bool)local_8f) {
      local_94 = 0;
      if ((local_c & 4) != 0) {
        local_94 = 0x1000;
      }
      if ((local_8d & 1) == 0) {
        local_94 = local_94 | 0x200;
      }
      local_98 = (in_stack_ffffffffffffff8c - local_118) - (local_38->TouchExtraPadding).x;
      local_9c = (in_stack_ffffffffffffff8c - local_118) +
                 local_44.x + local_44.x + local_30->FontSize + (local_38->TouchExtraPadding).x;
      uVar8 = false;
      if (local_98 <= (local_30->IO).MousePos.x) {
        uVar8 = (local_30->IO).MousePos.x < local_9c;
      }
      if ((local_28 != local_30->HoveredWindow) || ((bool)uVar8 == false)) {
        local_94 = local_94 | 0x10000;
      }
      if ((bool)uVar8 == false) {
        if ((local_c & 0x40) == 0) {
          local_94 = local_94 | 0x20;
        }
        else {
          local_94 = local_94 | 0x120;
        }
      }
      else {
        local_94 = local_94 | 0x10;
      }
      local_9f = (local_c & 1) != 0;
      local_9e = local_9f;
      local_9d = uVar8;
      local_a2 = ButtonBehavior(in_stack_ffffffffffffff10,(ImGuiID)in_stack_ffffffffffffff0c,
                                (bool *)in_stack_ffffffffffffff00,(bool *)in_stack_fffffffffffffef8,
                                (ImGuiButtonFlags)in_stack_fffffffffffffef4);
      local_a3 = false;
      if ((local_8d & 1) == 0) {
        if (((bool)local_a2) && (local_30->DragDropHoldJustPressedId != local_8)) {
          if (((local_c & 0xc0) == 0) || (local_30->NavActivateId == local_8)) {
            local_a3 = true;
          }
          if ((local_c & 0x80) != 0) {
            in_stack_fffffffffffffede = 0;
            if ((local_9d & 1) != 0) {
              in_stack_fffffffffffffede = local_30->NavDisableMouseHover ^ 0xff;
            }
            local_a3 = local_a3 != false || (in_stack_fffffffffffffede & 1) != 0;
          }
          if (((local_c & 0x40) != 0) && ((local_30->IO).MouseClickedCount[0] == 2)) {
            local_a3 = true;
          }
        }
        else if (((bool)local_a2) && (local_30->DragDropHoldJustPressedId == local_8)) {
          local_a3 = (local_8e & 1) == 0;
        }
        if (((local_30->NavId == local_8) && (local_30->NavMoveDir == 0)) && ((local_8e & 1) != 0))
        {
          local_a3 = true;
          NavMoveRequestCancel();
        }
        if (((local_30->NavId == local_8) && (local_30->NavMoveDir == 1)) && ((local_8e & 1) == 0))
        {
          local_a3 = true;
          NavMoveRequestCancel();
        }
        if ((local_a3 & 1U) != 0) {
          local_8e = (local_8e ^ 0xff) & 1;
          ImGuiStorage::SetInt
                    (in_stack_fffffffffffffec0,(ImGuiID)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                     (int)in_stack_fffffffffffffeb8);
          (local_30->LastItemData).StatusFlags = (local_30->LastItemData).StatusFlags | 0x10;
        }
      }
      if ((local_c & 4) != 0) {
        SetItemAllowOverlap();
      }
      if ((local_9e & 1) != (local_9f & 1)) {
        (local_30->LastItemData).StatusFlags = (local_30->LastItemData).StatusFlags | 8;
      }
      local_a8 = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                             (float)in_stack_fffffffffffffea0);
      local_ac = 2;
      idx = (ImGuiCol)((ulong)in_stack_fffffffffffffea0 >> 0x20);
      if ((local_39 & 1) == 0) {
        if (((local_a0 & 1) != 0) || ((local_9e & 1) != 0)) {
          GetColorU32(idx,(float)in_stack_fffffffffffffea0);
          RenderFrame(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                      (ImU32)in_stack_fffffffffffffef4,SUB41((uint)fVar10 >> 0x18,0),rounding);
        }
        hide_text_after_hash = (undefined1)((ulong)in_stack_fffffffffffffec8 >> 0x38);
        RenderNavHighlight((ImRect *)in_stack_ffffffffffffff30,(ImGuiID)in_stack_ffffffffffffff2c,
                           (ImGuiNavHighlightFlags)in_stack_ffffffffffffff28);
        if ((local_c & 0x200) == 0) {
          if ((local_8d & 1) == 0) {
            ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff00,
                           (in_stack_ffffffffffffff8c - local_118) + local_44.x,
                           local_30->FontSize * 0.15 + in_stack_ffffffffffffff90);
            pos_03.y = fVar11;
            pos_03.x = fVar4;
            RenderArrow((ImDrawList *)CONCAT44(local_118,fVar5),pos_03,(ImU32)_x,
                        (ImGuiDir)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
          }
        }
        else {
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff08,
                         in_stack_ffffffffffffff8c - local_118 * 0.5,
                         local_30->FontSize * 0.5 + in_stack_ffffffffffffff90);
          pos_00.y = in_stack_fffffffffffffe94;
          pos_00.x = in_stack_fffffffffffffe90;
          RenderBullet(in_stack_fffffffffffffe88,pos_00,0);
        }
        if ((local_30->LogEnabled & 1U) != 0) {
          LogSetNextTextDecoration(">",(char *)0x0);
        }
        pos_01.y = fVar9;
        pos_01.x = local_4c;
        RenderText(pos_01,(char *)CONCAT17(uVar8,CONCAT16(in_stack_fffffffffffffede,
                                                          CONCAT24(in_stack_fffffffffffffedc,
                                                                   in_stack_fffffffffffffed8))),
                   (char *)in_stack_fffffffffffffed0,(bool)hide_text_after_hash);
      }
      else {
        if (((local_a1 & 1) == 0) || ((local_a0 & 1) == 0)) {
          uVar7 = 0x18;
          if ((local_a0 & 1) != 0) {
            uVar7 = 0x19;
          }
        }
        else {
          uVar7 = 0x1a;
        }
        local_b0 = GetColorU32(idx,(float)in_stack_fffffffffffffea0);
        local_b8 = CONCAT44(fVar11,fVar4);
        local_c0 = CONCAT44(fVar3,local_58);
        RenderFrame(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                    (ImU32)in_stack_fffffffffffffef4,SUB41((uint)fVar10 >> 0x18,0),rounding);
        RenderNavHighlight((ImRect *)in_stack_ffffffffffffff30,(ImGuiID)in_stack_ffffffffffffff2c,
                           (ImGuiNavHighlightFlags)in_stack_ffffffffffffff28);
        if ((local_c & 0x200) == 0) {
          if ((local_8d & 1) == 0) {
            in_stack_fffffffffffffec8 = local_28->DrawList;
            ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff30,
                           (in_stack_ffffffffffffff8c - local_118) + local_44.x,
                           in_stack_ffffffffffffff90);
            pos_02.y = fVar11;
            pos_02.x = fVar4;
            RenderArrow((ImDrawList *)CONCAT44(local_118,fVar5),pos_02,(ImU32)_x,
                        (ImGuiDir)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
          }
        }
        else {
          in_stack_fffffffffffffed0 = local_28->DrawList;
          ImVec2::ImVec2(&local_c8,in_stack_ffffffffffffff8c + local_118 * -0.6,
                         local_30->FontSize * 0.5 + in_stack_ffffffffffffff90);
          pos.y = in_stack_fffffffffffffe94;
          pos.x = in_stack_fffffffffffffe90;
          RenderBullet(in_stack_fffffffffffffe88,pos,0);
        }
        if ((local_30->LogEnabled & 1U) != 0) {
          LogSetNextTextDecoration("###","###");
        }
        text_size_if_known = local_20;
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff28,0.0,0.0);
        RenderTextClipped((ImVec2 *)CONCAT44(fVar9,local_4c),
                          (ImVec2 *)
                          CONCAT17(uVar8,CONCAT16(in_stack_fffffffffffffede,
                                                  CONCAT24(in_stack_fffffffffffffedc,uVar7))),
                          (char *)in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,
                          text_size_if_known,local_18,
                          (ImRect *)CONCAT44(in_stack_fffffffffffffef4,fVar10));
      }
      if (((local_8e & 1) != 0) && ((local_c & 8) == 0)) {
        TreePushOverrideID((ImGuiID)in_stack_fffffffffffffe94);
      }
      local_1 = (bool)(local_8e & 1);
    }
    else {
      if (((local_8e & 1) != 0) && ((local_c & 8) == 0)) {
        TreePushOverrideID((ImGuiID)in_stack_fffffffffffffe94);
      }
      local_1 = (bool)(local_8e & 1);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::TreeNodeBehavior(ImGuiID id, ImGuiTreeNodeFlags flags, const char* label, const char* label_end)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const bool display_frame = (flags & ImGuiTreeNodeFlags_Framed) != 0;
    const ImVec2 padding = (display_frame || (flags & ImGuiTreeNodeFlags_FramePadding)) ? style.FramePadding : ImVec2(style.FramePadding.x, ImMin(window->DC.CurrLineTextBaseOffset, style.FramePadding.y));

    if (!label_end)
        label_end = FindRenderedTextEnd(label);
    const ImVec2 label_size = CalcTextSize(label, label_end, false);

    // We vertically grow up to current line height up the typical widget height.
    const float frame_height = ImMax(ImMin(window->DC.CurrLineSize.y, g.FontSize + style.FramePadding.y * 2), label_size.y + padding.y * 2);
    ImRect frame_bb;
    frame_bb.Min.x = (flags & ImGuiTreeNodeFlags_SpanFullWidth) ? window->WorkRect.Min.x : window->DC.CursorPos.x;
    frame_bb.Min.y = window->DC.CursorPos.y;
    frame_bb.Max.x = window->WorkRect.Max.x;
    frame_bb.Max.y = window->DC.CursorPos.y + frame_height;
    if (display_frame)
    {
        // Framed header expand a little outside the default padding, to the edge of InnerClipRect
        // (FIXME: May remove this at some point and make InnerClipRect align with WindowPadding.x instead of WindowPadding.x*0.5f)
        frame_bb.Min.x -= IM_FLOOR(window->WindowPadding.x * 0.5f - 1.0f);
        frame_bb.Max.x += IM_FLOOR(window->WindowPadding.x * 0.5f);
    }

    const float text_offset_x = g.FontSize + (display_frame ? padding.x * 3 : padding.x * 2);           // Collapser arrow width + Spacing
    const float text_offset_y = ImMax(padding.y, window->DC.CurrLineTextBaseOffset);                    // Latch before ItemSize changes it
    const float text_width = g.FontSize + (label_size.x > 0.0f ? label_size.x + padding.x * 2 : 0.0f);  // Include collapser
    ImVec2 text_pos(window->DC.CursorPos.x + text_offset_x, window->DC.CursorPos.y + text_offset_y);
    ItemSize(ImVec2(text_width, frame_height), padding.y);

    // For regular tree nodes, we arbitrary allow to click past 2 worth of ItemSpacing
    ImRect interact_bb = frame_bb;
    if (!display_frame && (flags & (ImGuiTreeNodeFlags_SpanAvailWidth | ImGuiTreeNodeFlags_SpanFullWidth)) == 0)
        interact_bb.Max.x = frame_bb.Min.x + text_width + style.ItemSpacing.x * 2.0f;

    // Store a flag for the current depth to tell if we will allow closing this node when navigating one of its child.
    // For this purpose we essentially compare if g.NavIdIsAlive went from 0 to 1 between TreeNode() and TreePop().
    // This is currently only support 32 level deep and we are fine with (1 << Depth) overflowing into a zero.
    const bool is_leaf = (flags & ImGuiTreeNodeFlags_Leaf) != 0;
    bool is_open = TreeNodeUpdateNextOpen(id, flags);
    if (is_open && !g.NavIdIsAlive && (flags & ImGuiTreeNodeFlags_NavLeftJumpsBackHere) && !(flags & ImGuiTreeNodeFlags_NoTreePushOnOpen))
        window->DC.TreeJumpToParentOnPopMask |= (1 << window->DC.TreeDepth);

    bool item_add = ItemAdd(interact_bb, id);
    g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HasDisplayRect;
    g.LastItemData.DisplayRect = frame_bb;

    if (!item_add)
    {
        if (is_open && !(flags & ImGuiTreeNodeFlags_NoTreePushOnOpen))
            TreePushOverrideID(id);
        IMGUI_TEST_ENGINE_ITEM_INFO(g.LastItemData.ID, label, g.LastItemData.StatusFlags | (is_leaf ? 0 : ImGuiItemStatusFlags_Openable) | (is_open ? ImGuiItemStatusFlags_Opened : 0));
        return is_open;
    }

    ImGuiButtonFlags button_flags = ImGuiTreeNodeFlags_None;
    if (flags & ImGuiTreeNodeFlags_AllowItemOverlap)
        button_flags |= ImGuiButtonFlags_AllowItemOverlap;
    if (!is_leaf)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;

    // We allow clicking on the arrow section with keyboard modifiers held, in order to easily
    // allow browsing a tree while preserving selection with code implementing multi-selection patterns.
    // When clicking on the rest of the tree node we always disallow keyboard modifiers.
    const float arrow_hit_x1 = (text_pos.x - text_offset_x) - style.TouchExtraPadding.x;
    const float arrow_hit_x2 = (text_pos.x - text_offset_x) + (g.FontSize + padding.x * 2.0f) + style.TouchExtraPadding.x;
    const bool is_mouse_x_over_arrow = (g.IO.MousePos.x >= arrow_hit_x1 && g.IO.MousePos.x < arrow_hit_x2);
    if (window != g.HoveredWindow || !is_mouse_x_over_arrow)
        button_flags |= ImGuiButtonFlags_NoKeyModifiers;

    // Open behaviors can be altered with the _OpenOnArrow and _OnOnDoubleClick flags.
    // Some alteration have subtle effects (e.g. toggle on MouseUp vs MouseDown events) due to requirements for multi-selection and drag and drop support.
    // - Single-click on label = Toggle on MouseUp (default, when _OpenOnArrow=0)
    // - Single-click on arrow = Toggle on MouseDown (when _OpenOnArrow=0)
    // - Single-click on arrow = Toggle on MouseDown (when _OpenOnArrow=1)
    // - Double-click on label = Toggle on MouseDoubleClick (when _OpenOnDoubleClick=1)
    // - Double-click on arrow = Toggle on MouseDoubleClick (when _OpenOnDoubleClick=1 and _OpenOnArrow=0)
    // It is rather standard that arrow click react on Down rather than Up.
    // We set ImGuiButtonFlags_PressedOnClickRelease on OpenOnDoubleClick because we want the item to be active on the initial MouseDown in order for drag and drop to work.
    if (is_mouse_x_over_arrow)
        button_flags |= ImGuiButtonFlags_PressedOnClick;
    else if (flags & ImGuiTreeNodeFlags_OpenOnDoubleClick)
        button_flags |= ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnDoubleClick;
    else
        button_flags |= ImGuiButtonFlags_PressedOnClickRelease;

    bool selected = (flags & ImGuiTreeNodeFlags_Selected) != 0;
    const bool was_selected = selected;

    bool hovered, held;
    bool pressed = ButtonBehavior(interact_bb, id, &hovered, &held, button_flags);
    bool toggled = false;
    if (!is_leaf)
    {
        if (pressed && g.DragDropHoldJustPressedId != id)
        {
            if ((flags & (ImGuiTreeNodeFlags_OpenOnArrow | ImGuiTreeNodeFlags_OpenOnDoubleClick)) == 0 || (g.NavActivateId == id))
                toggled = true;
            if (flags & ImGuiTreeNodeFlags_OpenOnArrow)
                toggled |= is_mouse_x_over_arrow && !g.NavDisableMouseHover; // Lightweight equivalent of IsMouseHoveringRect() since ButtonBehavior() already did the job
            if ((flags & ImGuiTreeNodeFlags_OpenOnDoubleClick) && g.IO.MouseClickedCount[0] == 2)
                toggled = true;
        }
        else if (pressed && g.DragDropHoldJustPressedId == id)
        {
            IM_ASSERT(button_flags & ImGuiButtonFlags_PressedOnDragDropHold);
            if (!is_open) // When using Drag and Drop "hold to open" we keep the node highlighted after opening, but never close it again.
                toggled = true;
        }

        if (g.NavId == id && g.NavMoveDir == ImGuiDir_Left && is_open)
        {
            toggled = true;
            NavMoveRequestCancel();
        }
        if (g.NavId == id && g.NavMoveDir == ImGuiDir_Right && !is_open) // If there's something upcoming on the line we may want to give it the priority?
        {
            toggled = true;
            NavMoveRequestCancel();
        }

        if (toggled)
        {
            is_open = !is_open;
            window->DC.StateStorage->SetInt(id, is_open);
            g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_ToggledOpen;
        }
    }
    if (flags & ImGuiTreeNodeFlags_AllowItemOverlap)
        SetItemAllowOverlap();

    // In this branch, TreeNodeBehavior() cannot toggle the selection so this will never trigger.
    if (selected != was_selected) //-V547
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_ToggledSelection;

    // Render
    const ImU32 text_col = GetColorU32(ImGuiCol_Text);
    ImGuiNavHighlightFlags nav_highlight_flags = ImGuiNavHighlightFlags_TypeThin;
    if (display_frame)
    {
        // Framed type
        const ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
        RenderFrame(frame_bb.Min, frame_bb.Max, bg_col, true, style.FrameRounding);
        RenderNavHighlight(frame_bb, id, nav_highlight_flags);
        if (flags & ImGuiTreeNodeFlags_Bullet)
            RenderBullet(window->DrawList, ImVec2(text_pos.x - text_offset_x * 0.60f, text_pos.y + g.FontSize * 0.5f), text_col);
        else if (!is_leaf)
            RenderArrow(window->DrawList, ImVec2(text_pos.x - text_offset_x + padding.x, text_pos.y), text_col, is_open ? ImGuiDir_Down : ImGuiDir_Right, 1.0f);
        else // Leaf without bullet, left-adjusted text
            text_pos.x -= text_offset_x;
        if (flags & ImGuiTreeNodeFlags_ClipLabelForTrailingButton)
            frame_bb.Max.x -= g.FontSize + style.FramePadding.x;

        if (g.LogEnabled)
            LogSetNextTextDecoration("###", "###");
        RenderTextClipped(text_pos, frame_bb.Max, label, label_end, &label_size);
    }
    else
    {
        // Unframed typed for tree nodes
        if (hovered || selected)
        {
            const ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
            RenderFrame(frame_bb.Min, frame_bb.Max, bg_col, false);
        }
        RenderNavHighlight(frame_bb, id, nav_highlight_flags);
        if (flags & ImGuiTreeNodeFlags_Bullet)
            RenderBullet(window->DrawList, ImVec2(text_pos.x - text_offset_x * 0.5f, text_pos.y + g.FontSize * 0.5f), text_col);
        else if (!is_leaf)
            RenderArrow(window->DrawList, ImVec2(text_pos.x - text_offset_x + padding.x, text_pos.y + g.FontSize * 0.15f), text_col, is_open ? ImGuiDir_Down : ImGuiDir_Right, 0.70f);
        if (g.LogEnabled)
            LogSetNextTextDecoration(">", NULL);
        RenderText(text_pos, label, label_end, false);
    }

    if (is_open && !(flags & ImGuiTreeNodeFlags_NoTreePushOnOpen))
        TreePushOverrideID(id);
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags | (is_leaf ? 0 : ImGuiItemStatusFlags_Openable) | (is_open ? ImGuiItemStatusFlags_Opened : 0));
    return is_open;
}